

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_strategy.cpp
# Opt level: O1

void __thiscall
EscapeStrategy::generateActions(EscapeStrategy *this,PlayerSight *sight,Actions *actions)

{
  long lVar1;
  long lVar2;
  Vec2 pos;
  bool bVar3;
  Randomizer *this_00;
  Router *this_01;
  int iVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vec2 pos_00;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if ((this->super_Strategy).disabled == false) {
    pos_00 = sight->pos;
    if (0 < this->tries) {
      iVar4 = 0;
      fVar13 = pos_00.y;
      fVar12 = pos_00.x;
      fVar9 = 0.0;
      do {
        do {
          this_00 = Randomizer::getInstance();
          fVar6 = Randomizer::randXAxis(this_00);
          fVar10 = (fVar6 * 3.1415927) / 60.0 + 3.1415927;
          fVar6 = cosf(fVar10);
          fVar7 = sinf(fVar10);
          fVar10 = fVar6 + fVar6 + (sight->pos).x;
          fVar6 = fVar7 + fVar7 + (sight->pos).y;
          this_01 = Router::getInstance();
          pos.y = fVar6;
          pos.x = fVar10;
          bVar3 = Router::Reachable(this_01,pos);
        } while (bVar3);
        lVar1 = *(long *)&sight->field_0x80;
        if (*(long *)&sight->unitInSight == lVar1) {
          fVar7 = 0.0;
        }
        else {
          fVar7 = 0.0;
          lVar2 = *(long *)&sight->unitInSight;
          do {
            lVar5 = lVar2 + 0x14;
            fVar8 = *(float *)(lVar2 + 4) - (sight->pos).x;
            fVar11 = *(float *)(lVar2 + 8) - (sight->pos).y;
            fVar8 = fVar8 * fVar8 + fVar11 * fVar11;
            if (fVar8 < 0.0) {
              fVar8 = sqrtf(fVar8);
            }
            else {
              fVar8 = SQRT(fVar8);
            }
            fVar7 = (float)(-(uint)(fVar8 < 0.0001) & 0x4cbebc20 |
                           ~-(uint)(fVar8 < 0.0001) & (uint)(fVar7 + 1.0 / fVar8));
          } while ((0.0001 <= fVar8) && (lVar2 = lVar5, lVar5 != lVar1));
        }
        if (fVar9 <= fVar7) {
          fVar7 = fVar9;
          fVar6 = fVar13;
          fVar10 = fVar12;
        }
        iVar4 = iVar4 + 1;
        pos_00.y = fVar6;
        pos_00.x = fVar10;
        fVar13 = fVar6;
        fVar12 = fVar10;
        fVar9 = fVar7;
      } while (iVar4 < this->tries);
    }
    Actions::emplace(actions,SelectDestination,sight->id,pos_00);
    return;
  }
  return;
}

Assistant:

void EscapeStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    Vec2 best(sight.pos);
    float best_score = 0;
    for (int i = 0; i < tries; ++i)
    {
        Vec2 goal;
        do          //使用Randomizer的AxisRnd，通过变换生成一个均匀分布在(0, 2π)的随机角度
        {
            float rad = (Randomizer::getInstance()->randXAxis()) * PI / MapWidth + PI;
            Vec2 e0(cos(rad), sin(rad));
            goal = sight.pos + e0 * PlayerVelocity;
        } while (Router::getInstance()->Reachable(goal));
        float score = 0;
        for (auto uinfo : sight.unitInSight)
        {
            float dis = (uinfo.pos - sight.pos).length();
            if (dis < EPS)
            {
                score = FINF;
                break;
            }
            score += 1 / dis;
        }
        if (score < best_score)
        {
            best_score = score;
            best = goal;
        }
    }
    actions->emplace(SelectDestination, sight.id, best);
}